

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

void __thiscall dense_parameters::share(dense_parameters *this,size_t length)

{
  weight *__dest;
  
  __dest = (weight *)
           mmap64((void *)0x0,(length << ((byte)this->_stride_shift & 0x3f)) << 2,3,0x21,-1,0);
  memcpy(__dest,this->_begin,(length << ((byte)this->_stride_shift & 0x3f)) << 2);
  free(this->_begin);
  this->_begin = __dest;
  return;
}

Assistant:

void share(size_t length)
  {
    float* shared_weights = (float*)mmap(
        0, (length << _stride_shift) * sizeof(float), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS, -1, 0);
    size_t float_count = length << _stride_shift;
    weight* dest = shared_weights;
    memcpy(dest, _begin, float_count * sizeof(float));
    free(_begin);
    _begin = dest;
  }